

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
emplaceRealloc<slang::ast::StreamingConcatenationExpression::StreamExpression>
          (SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *this,
          pointer pos,StreamExpression *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pSVar3;
  StreamExpression *__result;
  StreamExpression *pSVar4;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  StreamExpression *args_local;
  pointer pos_local;
  SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *this_local;
  
  sVar1 = this->len;
  sVar2 = max_size(this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pSVar3 = begin(this);
  __result = (StreamExpression *)slang::detail::allocArray(capacity,0x18);
  pSVar4 = __result + ((long)pos - (long)pSVar3) / 0x18;
  (pSVar4->operand).ptr = (args->operand).ptr;
  pSVar4->withExpr = args->withExpr;
  (pSVar4->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (args->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  pSVar3 = end(this);
  if (pos == pSVar3) {
    __first = begin(this);
    pSVar3 = end(this);
    std::
    uninitialized_move<slang::ast::StreamingConcatenationExpression::StreamExpression*,slang::ast::StreamingConcatenationExpression::StreamExpression*>
              (__first,pSVar3,__result);
  }
  else {
    pSVar3 = begin(this);
    std::
    uninitialized_move<slang::ast::StreamingConcatenationExpression::StreamExpression*,slang::ast::StreamingConcatenationExpression::StreamExpression*>
              (pSVar3,pos,__result);
    pSVar3 = end(this);
    std::
    uninitialized_move<slang::ast::StreamingConcatenationExpression::StreamExpression*,slang::ast::StreamingConcatenationExpression::StreamExpression*>
              (pos,pSVar3,pSVar4 + 1);
  }
  cleanup(this,(EVP_PKEY_CTX *)pSVar3);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return pSVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}